

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O2

Index IndexTools::IndividualToJointIndicesArrayStepSize
                (Index *indices,vector<unsigned_long,_std::allocator<unsigned_long>_> *step_size,
                size_t vec_size)

{
  Index IVar1;
  uint uVar2;
  ulong uVar3;
  
  IVar1 = 0;
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    if (vec_size <= uVar3) break;
    uVar2 = uVar2 + 1;
    IVar1 = IVar1 + indices[uVar3] *
                    (int)(step_size->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar3];
  }
  return IVar1;
}

Assistant:

Index IndexTools::IndividualToJointIndicesArrayStepSize(const Index* indices,
        const vector<size_t> &step_size, size_t vec_size) 
{
    Index jointI = 0;
    for(Index i=0; i < vec_size ; i++)            
        jointI += indices[i] * step_size[i];
    return(jointI);
}